

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::StringifyMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,Message *message,Option option,
          FieldReporterLevel reporter_level)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  Printer printer;
  
  iVar1 = *(int *)(in_FS_OFFSET + -0x38);
  if (iVar1 < 1) {
    *(undefined4 *)(in_FS_OFFSET + -0x38) = 1;
  }
  TextFormat::Printer::Printer(&printer);
  iVar2 = (int)message;
  if (iVar2 == 1) {
    printer.single_line_mode_ = true;
  }
  else if (iVar2 == 2) {
    TextFormat::Printer::SetUseUtf8StringEscaping(&printer,true);
  }
  printer.expand_any_ = true;
  printer.redact_debug_string_ = true;
  printer.randomize_debug_string_ = true;
  if ((int)printer.report_sensitive_fields_ < (int)option) {
    printer.report_sensitive_fields_ = option;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::PrintToString(&printer,(Message *)this,__return_storage_ptr__);
  if (((iVar2 == 1) && (__return_storage_ptr__->_M_string_length != 0)) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      ' ')) {
    std::__cxx11::string::pop_back();
  }
  TextFormat::Printer::~Printer(&printer);
  *(int *)(in_FS_OFFSET + -0x38) = iVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string StringifyMessage(const Message& message, Option option,
                             FieldReporterLevel reporter_level) {
  // Indicate all scoped reflection calls are from DebugString function.
  ScopedReflectionMode scope(ReflectionMode::kDebugString);

  TextFormat::Printer printer;
  internal::FieldReporterLevel reporter = reporter_level;
  switch (option) {
    case Option::kShort:
      printer.SetSingleLineMode(true);
      break;
    case Option::kUTF8:
      printer.SetUseUtf8StringEscaping(true);
      break;
    case Option::kNone:
      break;
  }
  printer.SetExpandAny(true);
  printer.SetRedactDebugString(true);
  printer.SetRandomizeDebugString(true);
  printer.SetReportSensitiveFields(reporter);
  std::string result;
  printer.PrintToString(message, &result);

  if (option == Option::kShort) {
    TrimTrailingSpace(result);
  }

  return result;
}